

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlRegexpPtr xmlRegexpCompile(xmlChar *regexp)

{
  xmlRegParserCtxtPtr ctxt;
  xmlChar *pxVar1;
  xmlRegStatePtr pxVar2;
  xmlRegexpPtr pxVar3;
  
  if (regexp == (xmlChar *)0x0) {
    return (xmlRegexpPtr)0x0;
  }
  ctxt = (xmlRegParserCtxtPtr)(*xmlMalloc)(0x78);
  if (ctxt == (xmlRegParserCtxtPtr)0x0) {
LAB_0017c4b1:
    ctxt = (xmlRegParserCtxtPtr)0x0;
  }
  else {
    ctxt->counters = (xmlRegCounter *)0x0;
    ctxt->determinist = 0;
    ctxt->negs = 0;
    ctxt->states = (xmlRegStatePtr *)0x0;
    ctxt->maxCounters = 0;
    ctxt->nbCounters = 0;
    ctxt->atoms = (xmlRegAtomPtr *)0x0;
    ctxt->maxStates = 0;
    ctxt->nbStates = 0;
    ctxt->atom = (xmlRegAtomPtr)0x0;
    ctxt->maxAtoms = 0;
    ctxt->nbAtoms = 0;
    ctxt->end = (xmlRegStatePtr)0x0;
    ctxt->state = (xmlRegStatePtr)0x0;
    ctxt->error = 0;
    ctxt->neg = 0;
    ctxt->start = (xmlRegStatePtr)0x0;
    ctxt->string = (xmlChar *)0x0;
    ctxt->cur = (xmlChar *)0x0;
    ctxt->flags = 0;
    ctxt->depth = 0;
    pxVar1 = xmlStrdup(regexp);
    ctxt->string = pxVar1;
    if (pxVar1 == (xmlChar *)0x0) {
      (*xmlFree)(ctxt);
      goto LAB_0017c4b1;
    }
    ctxt->cur = ctxt->string;
    ctxt->error = 0;
    ctxt->neg = 0;
    ctxt->determinist = -1;
    ctxt->negs = 0;
  }
  if (ctxt == (xmlRegParserCtxtPtr)0x0) {
    return (xmlRegexpPtr)0x0;
  }
  pxVar2 = xmlRegStatePush(ctxt);
  ctxt->state = pxVar2;
  if (pxVar2 != (xmlRegStatePtr)0x0) {
    ctxt->start = pxVar2;
    ctxt->end = (xmlRegStatePtr)0x0;
    xmlFAParseRegExp(ctxt,1);
    if (*ctxt->cur != '\0') {
      ctxt->error = 0x5aa;
      xmlRegexpErrCompile(ctxt,"xmlFAParseRegExp: extra characters");
    }
    if (ctxt->error == 0) {
      pxVar2 = ctxt->state;
      ctxt->end = pxVar2;
      ctxt->start->type = XML_REGEXP_START_STATE;
      pxVar2->type = XML_REGEXP_FINAL_STATE;
      xmlFAEliminateEpsilonTransitions(ctxt);
      if (ctxt->error == 0) {
        pxVar3 = xmlRegEpxFromParse(ctxt);
        goto LAB_0017c534;
      }
    }
  }
  pxVar3 = (xmlRegexpPtr)0x0;
LAB_0017c534:
  xmlRegFreeParserCtxt(ctxt);
  return pxVar3;
}

Assistant:

xmlRegexpPtr
xmlRegexpCompile(const xmlChar *regexp) {
    xmlRegexpPtr ret = NULL;
    xmlRegParserCtxtPtr ctxt;

    if (regexp == NULL)
        return(NULL);

    ctxt = xmlRegNewParserCtxt(regexp);
    if (ctxt == NULL)
	return(NULL);

    /* initialize the parser */
    ctxt->state = xmlRegStatePush(ctxt);
    if (ctxt->state == NULL)
        goto error;
    ctxt->start = ctxt->state;
    ctxt->end = NULL;

    /* parse the expression building an automata */
    xmlFAParseRegExp(ctxt, 1);
    if (CUR != 0) {
	ERROR("xmlFAParseRegExp: extra characters");
    }
    if (ctxt->error != 0)
        goto error;
    ctxt->end = ctxt->state;
    ctxt->start->type = XML_REGEXP_START_STATE;
    ctxt->end->type = XML_REGEXP_FINAL_STATE;

    /* remove the Epsilon except for counted transitions */
    xmlFAEliminateEpsilonTransitions(ctxt);


    if (ctxt->error != 0)
        goto error;
    ret = xmlRegEpxFromParse(ctxt);

error:
    xmlRegFreeParserCtxt(ctxt);
    return(ret);
}